

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Scatter_acc(int g_a,void *v,int **subsArray,int n,void *alpha)

{
  Integer nv;
  Integer a;
  int i;
  int idx;
  void *in_stack_000001d8;
  Integer in_stack_000001e0;
  Integer in_stack_000001e8;
  void *in_stack_000001f0;
  void *in_stack_000001f8;
  Integer in_stack_00000200;
  
  pnga_scatter_acc(in_stack_00000200,in_stack_000001f8,in_stack_000001f0,in_stack_000001e8,
                   in_stack_000001e0,in_stack_000001d8);
  return;
}

Assistant:

void NGA_Scatter_acc(int g_a, void *v, int* subsArray[], int n, void *alpha)
{
    int idx, i;
    Integer a = (Integer)g_a;
    Integer nv = (Integer)n;
#ifndef USE_GATSCAT_NEW
    Integer ndim = wnga_ndim(a);
    Integer *_subs_array;
    _subs_array = (Integer *)malloc((int)ndim* n * sizeof(Integer));
    if(_subs_array == NULL) GA_Error("Memory allocation failed.", 0);
    for(idx=0; idx<n; idx++)
        for(i=0; i<ndim; i++)
            _subs_array[idx*ndim+(ndim-i-1)] = subsArray[idx][i] + 1;
    wnga_scatter_acc(a, v, _subs_array, 0, nv, alpha);
    free(_subs_array);
#else
    wnga_scatter_acc(a, v, subsArray, 1, nv, alpha);
#endif
}